

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool TestBlockValidity(BlockValidationState *state,CChainParams *chainparams,Chainstate *chainstate,
                      CBlock *block,CBlockIndex *pindexPrev,bool fCheckPOW,bool fCheckMerkleRoot)

{
  long lVar1;
  pointer ppCVar2;
  bool bVar3;
  CBlockIndex *pCVar4;
  CCoinsViewCache *baseIn;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string local_2d8;
  CBlockIndex local_2b8;
  uint256 block_hash;
  CCoinsViewCache viewNew;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (pindexPrev == (CBlockIndex *)0x0) {
LAB_00afceda:
    __assert_fail("pindexPrev && pindexPrev == chainstate.m_chain.Tip()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x1201,
                  "bool TestBlockValidity(BlockValidationState &, const CChainParams &, Chainstate &, const CBlock &, CBlockIndex *, bool, bool)"
                 );
  }
  ppCVar2 = (chainstate->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar2 ==
      (chainstate->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pCVar4 = (CBlockIndex *)0x0;
  }
  else {
    pCVar4 = ppCVar2[-1];
  }
  if (pCVar4 != pindexPrev) goto LAB_00afceda;
  baseIn = Chainstate::CoinsTip(chainstate);
  CCoinsViewCache::CCoinsViewCache(&viewNew,(CCoinsView *)baseIn,false);
  CBlockHeader::GetHash(&block_hash,&block->super_CBlockHeader);
  local_2b8.m_chain_tx_count = 0;
  local_2b8.nStatus = 0;
  local_2b8.pskip = (CBlockIndex *)0x0;
  local_2b8.nDataPos = 0;
  local_2b8.nUndoPos = 0;
  local_2b8.nChainWork.super_base_uint<256U>.pn[0] = 0;
  local_2b8.nChainWork.super_base_uint<256U>.pn[1] = 0;
  local_2b8.nChainWork.super_base_uint<256U>.pn[2] = 0;
  local_2b8.nChainWork.super_base_uint<256U>.pn[3] = 0;
  local_2b8.nChainWork.super_base_uint<256U>.pn[4] = 0;
  local_2b8.nChainWork.super_base_uint<256U>.pn[5] = 0;
  local_2b8.nChainWork.super_base_uint<256U>.pn[6] = 0;
  local_2b8.nChainWork.super_base_uint<256U>.pn[7] = 0;
  local_2b8.nTx = 0;
  local_2b8.nVersion = (block->super_CBlockHeader).nVersion;
  local_2b8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)
        (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems;
  local_2b8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)
        ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8);
  local_2b8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)
        ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10);
  local_2b8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)
        ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18);
  local_2b8.nTime = (block->super_CBlockHeader).nTime;
  local_2b8.nBits = (block->super_CBlockHeader).nBits;
  local_2b8.nNonce = (block->super_CBlockHeader).nNonce;
  local_2b8.nSequenceId = 0;
  local_2b8.nTimeMax = 0;
  local_2b8.nFile = 0;
  local_2b8.nHeight = pindexPrev->nHeight + 1;
  local_2b8.phashBlock = &block_hash;
  local_2b8.pprev = pindexPrev;
  bVar3 = ContextualCheckBlockHeader
                    (&block->super_CBlockHeader,state,chainstate->m_blockman,chainstate->m_chainman,
                     pindexPrev);
  if (bVar3) {
    bVar3 = CheckBlock(block,state,&chainparams->consensus,fCheckPOW,fCheckMerkleRoot);
    if (!bVar3) {
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                (&local_2d8,&state->super_ValidationState<BlockValidationResult>);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_00._M_len = 0x5e;
      logging_function_00._M_str = "TestBlockValidity";
      logging_function_00._M_len = 0x11;
      LogPrintFormatInternal<char[18],std::__cxx11::string>
                (logging_function_00,source_file_00,0x120f,ALL,Error,
                 (ConstevalFormatString<2U>)0xfd398f,(char (*) [18])"TestBlockValidity",&local_2d8);
      goto LAB_00afce12;
    }
    bVar3 = ContextualCheckBlock(block,state,chainstate->m_chainman,pindexPrev);
    if (!bVar3) {
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                (&local_2d8,&state->super_ValidationState<BlockValidationResult>);
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_01._M_len = 0x5e;
      logging_function_01._M_str = "TestBlockValidity";
      logging_function_01._M_len = 0x11;
      LogPrintFormatInternal<char[18],std::__cxx11::string>
                (logging_function_01,source_file_01,0x1213,ALL,Error,
                 (ConstevalFormatString<2U>)0xfd4c71,(char (*) [18])"TestBlockValidity",&local_2d8);
      goto LAB_00afce12;
    }
    bVar3 = Chainstate::ConnectBlock(chainstate,block,state,&local_2b8,&viewNew,true);
    if (bVar3) {
      bVar3 = true;
      if ((state->super_ValidationState<BlockValidationResult>).m_mode != M_VALID) {
        __assert_fail("state.IsValid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x1219,
                      "bool TestBlockValidity(BlockValidationState &, const CChainParams &, Chainstate &, const CBlock &, CBlockIndex *, bool, bool)"
                     );
      }
      goto LAB_00afce2f;
    }
  }
  else {
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
              (&local_2d8,&state->super_ValidationState<BlockValidationResult>);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file._M_len = 0x5e;
    logging_function._M_str = "TestBlockValidity";
    logging_function._M_len = 0x11;
    LogPrintFormatInternal<char[18],std::__cxx11::string>
              (logging_function,source_file,0x120b,ALL,Error,(ConstevalFormatString<2U>)0xfd4c42,
               (char (*) [18])"TestBlockValidity",&local_2d8);
LAB_00afce12:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
  }
  bVar3 = false;
LAB_00afce2f:
  viewNew.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
       (_func_int **)&PTR_GetCoin_013bb490;
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&viewNew.cacheCoins._M_h);
  if (viewNew.m_sentinel.second.m_flags != '\0') {
    ((viewNew.m_sentinel.second.m_next)->second).m_prev = viewNew.m_sentinel.second.m_prev;
    ((viewNew.m_sentinel.second.m_prev)->second).m_next = viewNew.m_sentinel.second.m_next;
    viewNew.m_sentinel.second.m_flags = '\0';
  }
  if (0x1c < viewNew.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._size) {
    free(viewNew.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
         indirect);
    viewNew.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
    indirect = (char *)0x0;
  }
  PoolResource<144UL,_8UL>::~PoolResource(&viewNew.m_cache_coins_memory_resource);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool TestBlockValidity(BlockValidationState& state,
                       const CChainParams& chainparams,
                       Chainstate& chainstate,
                       const CBlock& block,
                       CBlockIndex* pindexPrev,
                       bool fCheckPOW,
                       bool fCheckMerkleRoot)
{
    AssertLockHeld(cs_main);
    assert(pindexPrev && pindexPrev == chainstate.m_chain.Tip());
    CCoinsViewCache viewNew(&chainstate.CoinsTip());
    uint256 block_hash(block.GetHash());
    CBlockIndex indexDummy(block);
    indexDummy.pprev = pindexPrev;
    indexDummy.nHeight = pindexPrev->nHeight + 1;
    indexDummy.phashBlock = &block_hash;

    // NOTE: CheckBlockHeader is called by CheckBlock
    if (!ContextualCheckBlockHeader(block, state, chainstate.m_blockman, chainstate.m_chainman, pindexPrev)) {
        LogError("%s: Consensus::ContextualCheckBlockHeader: %s\n", __func__, state.ToString());
        return false;
    }
    if (!CheckBlock(block, state, chainparams.GetConsensus(), fCheckPOW, fCheckMerkleRoot)) {
        LogError("%s: Consensus::CheckBlock: %s\n", __func__, state.ToString());
        return false;
    }
    if (!ContextualCheckBlock(block, state, chainstate.m_chainman, pindexPrev)) {
        LogError("%s: Consensus::ContextualCheckBlock: %s\n", __func__, state.ToString());
        return false;
    }
    if (!chainstate.ConnectBlock(block, state, &indexDummy, viewNew, true)) {
        return false;
    }
    assert(state.IsValid());

    return true;
}